

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

double __thiscall
ON_SurfaceCurvature::KappaValue(ON_SurfaceCurvature *this,curvature_style kappa_style)

{
  double dVar1;
  
  switch(kappa_style) {
  case gaussian_curvature:
    dVar1 = GaussianCurvature(this);
    return dVar1;
  case mean_curvature:
    dVar1 = MeanCurvature(this);
    return ABS(dVar1);
  case min_curvature:
    dVar1 = MinimumRadius(this);
    return dVar1;
  case max_curvature:
    dVar1 = MaximumRadius(this);
    return dVar1;
  default:
    return ON_DBL_QNAN;
  }
}

Assistant:

double ON_SurfaceCurvature::KappaValue(ON::curvature_style kappa_style) const
{
  double k;
  switch (kappa_style)
  {
  case ON::gaussian_curvature:
    k = this->GaussianCurvature();
    break;

  case ON::mean_curvature:
    // fabs() is correct here.
    // Turns out the vast majority of users don't appear to care about 
    // signed mean curvature and find it confusing.
    k = fabs(this->MeanCurvature());
    break;

  case ON::min_curvature:
    k = this->MinimumRadius();
    break;

  case ON::max_curvature:
    k = this->MaximumRadius();
    break;

  default:
    k = ON_DBL_QNAN;
    break;
  }
  return k;
}